

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateGRULayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  uint64_t uVar1;
  uint64_t uVar2;
  undefined8 uVar3;
  bool bVar4;
  GRULayerParams *this_00;
  WeightParams *pWVar5;
  string *psVar6;
  uint64 uVar7;
  uint64 uVar8;
  RepeatedPtrField<CoreML::Specification::ActivationParams> *this_01;
  Result local_680;
  reference local_658;
  ActivationParams *activation;
  const_iterator __end1;
  const_iterator __begin1;
  RepeatedPtrField<CoreML::Specification::ActivationParams> *__range1;
  string local_630;
  allocator local_609;
  string local_608;
  Result local_5e8;
  allocator local_5b9;
  string local_5b8;
  allocator local_591;
  string local_590;
  Result local_570;
  allocator local_541;
  string local_540;
  allocator local_519;
  string local_518;
  Result local_4f8;
  uint64_t local_4d0;
  uint64_t bias_size;
  string local_4c0;
  allocator local_499;
  string local_498;
  Result local_478;
  allocator local_449;
  string local_448;
  allocator local_421;
  string local_420;
  Result local_400;
  allocator local_3d1;
  string local_3d0;
  allocator local_3a9;
  string local_3a8;
  Result local_388;
  uint64_t local_360;
  uint64_t recurrent_matrix_size;
  string local_350;
  allocator local_329;
  string local_328;
  Result local_308;
  allocator local_2d9;
  string local_2d8;
  allocator local_2b1;
  string local_2b0;
  Result local_290;
  allocator local_261;
  string local_260;
  allocator local_239;
  string local_238;
  Result local_218;
  uint64_t local_1f0;
  uint64_t outSize;
  uint64_t input_matrix_size;
  undefined1 local_1c0 [8];
  string err;
  WeightParamType local_198;
  WeightParamType local_194;
  WeightParamType local_190;
  WeightParamType local_18c;
  WeightParamType local_188;
  WeightParamType local_184;
  WeightParamType local_180;
  WeightParamType local_17c;
  undefined1 local_178 [8];
  vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> weightTypeList;
  bool hasBiasVectors;
  GRULayerParams *params;
  string local_148;
  Result local_128;
  allocator local_f9;
  string local_f8;
  Result local_d8;
  undefined4 local_ac;
  Result local_a8;
  Result local_70;
  undefined1 local_48 [8];
  Result r;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  
  r.m_message.field_2._8_8_ = layer;
  Result::Result((Result *)local_48);
  validateInputCount(&local_70,(NeuralNetworkLayer *)r.m_message.field_2._8_8_,1,2);
  Result::operator=((Result *)local_48,&local_70);
  Result::~Result(&local_70);
  bVar4 = Result::good((Result *)local_48);
  if (bVar4) {
    validateOutputCount(&local_a8,(NeuralNetworkLayer *)r.m_message.field_2._8_8_,2,2);
    Result::operator=((Result *)local_48,&local_a8);
    Result::~Result(&local_a8);
  }
  bVar4 = Result::good((Result *)local_48);
  if (!bVar4) {
    Result::Result(__return_storage_ptr__,(Result *)local_48);
    local_ac = 1;
    goto LAB_00a2a656;
  }
  bVar4 = Result::good((Result *)local_48);
  uVar3 = r.m_message.field_2._8_8_;
  if (!bVar4) {
    Result::Result(__return_storage_ptr__,(Result *)local_48);
    local_ac = 1;
    goto LAB_00a2a656;
  }
  if ((this->ndArrayInterpretation & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_f8,"GRU",&local_f9);
    validateInputOutputRankEquality
              (&local_d8,(NeuralNetworkLayer *)uVar3,&local_f8,&this->blobNameToRank);
    Result::operator=((Result *)local_48,&local_d8);
    Result::~Result(&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_f9);
    bVar4 = Result::good((Result *)local_48);
    uVar3 = r.m_message.field_2._8_8_;
    if (!bVar4) {
      Result::Result(__return_storage_ptr__,(Result *)local_48);
      local_ac = 1;
      goto LAB_00a2a656;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_148,"GRU",(allocator *)((long)&params + 7));
    validateRankCount(&local_128,(NeuralNetworkLayer *)uVar3,&local_148,5,5,&this->blobNameToRank);
    Result::operator=((Result *)local_48,&local_128);
    Result::~Result(&local_128);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator((allocator<char> *)((long)&params + 7));
    bVar4 = Result::good((Result *)local_48);
    if (!bVar4) {
      Result::Result(__return_storage_ptr__,(Result *)local_48);
      local_ac = 1;
      goto LAB_00a2a656;
    }
  }
  this_00 = Specification::NeuralNetworkLayer::gru((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
  weightTypeList.
  super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ =
       Specification::GRULayerParams::hasbiasvectors(this_00);
  std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::vector
            ((vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> *)local_178)
  ;
  pWVar5 = Specification::GRULayerParams::updategateweightmatrix(this_00);
  local_17c = valueType(pWVar5);
  std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::push_back
            ((vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> *)local_178,
             &local_17c);
  pWVar5 = Specification::GRULayerParams::updategaterecursionmatrix(this_00);
  local_180 = valueType(pWVar5);
  std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::push_back
            ((vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> *)local_178,
             &local_180);
  pWVar5 = Specification::GRULayerParams::resetgateweightmatrix(this_00);
  local_184 = valueType(pWVar5);
  std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::push_back
            ((vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> *)local_178,
             &local_184);
  pWVar5 = Specification::GRULayerParams::resetgaterecursionmatrix(this_00);
  local_188 = valueType(pWVar5);
  std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::push_back
            ((vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> *)local_178,
             &local_188);
  pWVar5 = Specification::GRULayerParams::outputgateweightmatrix(this_00);
  local_18c = valueType(pWVar5);
  std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::push_back
            ((vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> *)local_178,
             &local_18c);
  pWVar5 = Specification::GRULayerParams::outputgaterecursionmatrix(this_00);
  local_190 = valueType(pWVar5);
  std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::push_back
            ((vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> *)local_178,
             &local_190);
  if ((weightTypeList.
       super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>._M_impl
       .super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
    pWVar5 = Specification::GRULayerParams::updategatebiasvector(this_00);
    local_194 = valueType(pWVar5);
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::push_back
              ((vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> *)
               local_178,&local_194);
    pWVar5 = Specification::GRULayerParams::resetgatebiasvector(this_00);
    local_198 = valueType(pWVar5);
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::push_back
              ((vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> *)
               local_178,&local_198);
    pWVar5 = Specification::GRULayerParams::outputgatebiasvector(this_00);
    err.field_2._12_4_ = valueType(pWVar5);
    std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::push_back
              ((vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> *)
               local_178,(value_type *)(err.field_2._M_local_buf + 0xc));
  }
  bVar4 = isWeightParamTypeCompatible
                    ((vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> *)
                     local_178);
  if (bVar4) {
    uVar7 = Specification::GRULayerParams::inputvectorsize(this_00);
    uVar8 = Specification::GRULayerParams::outputvectorsize(this_00);
    outSize = uVar7 * uVar8;
    local_1f0 = Specification::GRULayerParams::outputvectorsize(this_00);
    pWVar5 = Specification::GRULayerParams::updategateweightmatrix(this_00);
    uVar2 = outSize;
    uVar1 = local_1f0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_238,"GRU",&local_239);
    psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                       ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_260,"update gate weight matrix",&local_261);
    validateGeneralWeightParams(&local_218,pWVar5,uVar2,uVar1,&local_238,psVar6,&local_260);
    Result::operator=((Result *)local_48,&local_218);
    Result::~Result(&local_218);
    std::__cxx11::string::~string((string *)&local_260);
    std::allocator<char>::~allocator((allocator<char> *)&local_261);
    std::__cxx11::string::~string((string *)&local_238);
    std::allocator<char>::~allocator((allocator<char> *)&local_239);
    bVar4 = Result::good((Result *)local_48);
    if (bVar4) {
      pWVar5 = Specification::GRULayerParams::resetgateweightmatrix(this_00);
      uVar2 = outSize;
      uVar1 = local_1f0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2b0,"GRU",&local_2b1);
      psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                         ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2d8,"reset gate weight matrix",&local_2d9);
      validateGeneralWeightParams(&local_290,pWVar5,uVar2,uVar1,&local_2b0,psVar6,&local_2d8);
      Result::operator=((Result *)local_48,&local_290);
      Result::~Result(&local_290);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
      bVar4 = Result::good((Result *)local_48);
      if (bVar4) {
        pWVar5 = Specification::GRULayerParams::outputgateweightmatrix(this_00);
        uVar2 = outSize;
        uVar1 = local_1f0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_328,"GRU",&local_329);
        psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                           ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_350,"output gate weight matrix",
                   (allocator *)((long)&recurrent_matrix_size + 7));
        validateGeneralWeightParams(&local_308,pWVar5,uVar2,uVar1,&local_328,psVar6,&local_350);
        Result::operator=((Result *)local_48,&local_308);
        Result::~Result(&local_308);
        std::__cxx11::string::~string((string *)&local_350);
        std::allocator<char>::~allocator((allocator<char> *)((long)&recurrent_matrix_size + 7));
        std::__cxx11::string::~string((string *)&local_328);
        std::allocator<char>::~allocator((allocator<char> *)&local_329);
        bVar4 = Result::good((Result *)local_48);
        if (bVar4) {
          uVar7 = Specification::GRULayerParams::outputvectorsize(this_00);
          uVar8 = Specification::GRULayerParams::outputvectorsize(this_00);
          local_360 = uVar7 * uVar8;
          pWVar5 = Specification::GRULayerParams::updategaterecursionmatrix(this_00);
          uVar2 = local_1f0;
          uVar1 = local_360;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_3a8,"GRU",&local_3a9);
          psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                             ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_3d0,"update gate recursion matrix",&local_3d1);
          validateGeneralWeightParams(&local_388,pWVar5,uVar1,uVar2,&local_3a8,psVar6,&local_3d0);
          Result::operator=((Result *)local_48,&local_388);
          Result::~Result(&local_388);
          std::__cxx11::string::~string((string *)&local_3d0);
          std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
          std::__cxx11::string::~string((string *)&local_3a8);
          std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
          bVar4 = Result::good((Result *)local_48);
          if (bVar4) {
            pWVar5 = Specification::GRULayerParams::resetgaterecursionmatrix(this_00);
            uVar2 = local_1f0;
            uVar1 = local_360;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_420,"GRU",&local_421);
            psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                               ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_448,"reset gate recursion matrix",&local_449);
            validateGeneralWeightParams(&local_400,pWVar5,uVar1,uVar2,&local_420,psVar6,&local_448);
            Result::operator=((Result *)local_48,&local_400);
            Result::~Result(&local_400);
            std::__cxx11::string::~string((string *)&local_448);
            std::allocator<char>::~allocator((allocator<char> *)&local_449);
            std::__cxx11::string::~string((string *)&local_420);
            std::allocator<char>::~allocator((allocator<char> *)&local_421);
            bVar4 = Result::good((Result *)local_48);
            if (bVar4) {
              pWVar5 = Specification::GRULayerParams::outputgaterecursionmatrix(this_00);
              uVar2 = local_1f0;
              uVar1 = local_360;
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_498,"GRU",&local_499);
              psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                 ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_4c0,"output gate recursion matrix",
                         (allocator *)((long)&bias_size + 7));
              validateGeneralWeightParams
                        (&local_478,pWVar5,uVar1,uVar2,&local_498,psVar6,&local_4c0);
              Result::operator=((Result *)local_48,&local_478);
              Result::~Result(&local_478);
              std::__cxx11::string::~string((string *)&local_4c0);
              std::allocator<char>::~allocator((allocator<char> *)((long)&bias_size + 7));
              std::__cxx11::string::~string((string *)&local_498);
              std::allocator<char>::~allocator((allocator<char> *)&local_499);
              bVar4 = Result::good((Result *)local_48);
              if (bVar4) {
                if ((weightTypeList.
                     super__Vector_base<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
LAB_00a2a4f4:
                  this_01 = Specification::GRULayerParams::activations(this_00);
                  __end1 = google::protobuf::
                           RepeatedPtrField<CoreML::Specification::ActivationParams>::begin(this_01)
                  ;
                  activation = (ActivationParams *)
                               google::protobuf::
                               RepeatedPtrField<CoreML::Specification::ActivationParams>::end
                                         (this_01);
                  while (bVar4 = google::protobuf::internal::
                                 RepeatedPtrIterator<const_CoreML::Specification::ActivationParams>
                                 ::operator!=(&__end1,(iterator *)&activation), bVar4) {
                    local_658 = google::protobuf::internal::
                                RepeatedPtrIterator<const_CoreML::Specification::ActivationParams>::
                                operator*(&__end1);
                    validateRecurrentActivationParams(&local_680,local_658);
                    Result::operator=((Result *)local_48,&local_680);
                    Result::~Result(&local_680);
                    bVar4 = Result::good((Result *)local_48);
                    if (!bVar4) break;
                    google::protobuf::internal::
                    RepeatedPtrIterator<const_CoreML::Specification::ActivationParams>::operator++
                              (&__end1);
                  }
                  Result::Result(__return_storage_ptr__,(Result *)local_48);
                  local_ac = 1;
                }
                else {
                  local_4d0 = Specification::GRULayerParams::outputvectorsize(this_00);
                  pWVar5 = Specification::GRULayerParams::updategatebiasvector(this_00);
                  uVar1 = local_4d0;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string((string *)&local_518,"GRU",&local_519);
                  psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                     ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            ((string *)&local_540,"update gate bias vector",&local_541);
                  validateGeneralWeightParams
                            (&local_4f8,pWVar5,uVar1,1,&local_518,psVar6,&local_540);
                  Result::operator=((Result *)local_48,&local_4f8);
                  Result::~Result(&local_4f8);
                  std::__cxx11::string::~string((string *)&local_540);
                  std::allocator<char>::~allocator((allocator<char> *)&local_541);
                  std::__cxx11::string::~string((string *)&local_518);
                  std::allocator<char>::~allocator((allocator<char> *)&local_519);
                  bVar4 = Result::good((Result *)local_48);
                  if (bVar4) {
                    pWVar5 = Specification::GRULayerParams::resetgatebiasvector(this_00);
                    uVar1 = local_4d0;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string((string *)&local_590,"GRU",&local_591);
                    psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                       ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string
                              ((string *)&local_5b8,"reset gate bias vector",&local_5b9);
                    validateGeneralWeightParams
                              (&local_570,pWVar5,uVar1,1,&local_590,psVar6,&local_5b8);
                    Result::operator=((Result *)local_48,&local_570);
                    Result::~Result(&local_570);
                    std::__cxx11::string::~string((string *)&local_5b8);
                    std::allocator<char>::~allocator((allocator<char> *)&local_5b9);
                    std::__cxx11::string::~string((string *)&local_590);
                    std::allocator<char>::~allocator((allocator<char> *)&local_591);
                    bVar4 = Result::good((Result *)local_48);
                    if (bVar4) {
                      pWVar5 = Specification::GRULayerParams::outputgatebiasvector(this_00);
                      uVar1 = local_4d0;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string((string *)&local_608,"GRU",&local_609);
                      psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                                         ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string
                                ((string *)&local_630,"output gate bias vector",
                                 (allocator *)((long)&__range1 + 7));
                      validateGeneralWeightParams
                                (&local_5e8,pWVar5,uVar1,1,&local_608,psVar6,&local_630);
                      Result::operator=((Result *)local_48,&local_5e8);
                      Result::~Result(&local_5e8);
                      std::__cxx11::string::~string((string *)&local_630);
                      std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
                      std::__cxx11::string::~string((string *)&local_608);
                      std::allocator<char>::~allocator((allocator<char> *)&local_609);
                      bVar4 = Result::good((Result *)local_48);
                      if (bVar4) goto LAB_00a2a4f4;
                      Result::Result(__return_storage_ptr__,(Result *)local_48);
                      local_ac = 1;
                    }
                    else {
                      Result::Result(__return_storage_ptr__,(Result *)local_48);
                      local_ac = 1;
                    }
                  }
                  else {
                    Result::Result(__return_storage_ptr__,(Result *)local_48);
                    local_ac = 1;
                  }
                }
              }
              else {
                Result::Result(__return_storage_ptr__,(Result *)local_48);
                local_ac = 1;
              }
            }
            else {
              Result::Result(__return_storage_ptr__,(Result *)local_48);
              local_ac = 1;
            }
          }
          else {
            Result::Result(__return_storage_ptr__,(Result *)local_48);
            local_ac = 1;
          }
        }
        else {
          Result::Result(__return_storage_ptr__,(Result *)local_48);
          local_ac = 1;
        }
      }
      else {
        Result::Result(__return_storage_ptr__,(Result *)local_48);
        local_ac = 1;
      }
    }
    else {
      Result::Result(__return_storage_ptr__,(Result *)local_48);
      local_ac = 1;
    }
  }
  else {
    psVar6 = Specification::NeuralNetworkLayer::name_abi_cxx11_
                       ((NeuralNetworkLayer *)r.m_message.field_2._8_8_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &input_matrix_size,"GRU layer \'",psVar6);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &input_matrix_size,
                   "\' has invalid weight/recursion matrix or bias fields. Field value types should match and should be either half or full precision"
                  );
    std::__cxx11::string::~string((string *)&input_matrix_size);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_1c0);
    local_ac = 1;
    std::__cxx11::string::~string((string *)local_1c0);
  }
  std::vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_>::~vector
            ((vector<CoreML::WeightParamType,_std::allocator<CoreML::WeightParamType>_> *)local_178)
  ;
LAB_00a2a656:
  Result::~Result((Result *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateGRULayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;

    // Must specify hidden states
    r = validateInputCount(layer, 1, 2);
    if (r.good()) {
        r = validateOutputCount(layer, 2, 2);
    }
    if (!r.good()) {
        return r;
    }

    if (!r.good()){ return r;}
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "GRU", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "GRU", 5, 5, blobNameToRank);
        if (!r.good()) {return r;}
    }

    const auto& params = layer.gru();
    bool hasBiasVectors = params.hasbiasvectors();

    std::vector<CoreML::WeightParamType> weightTypeList;
    weightTypeList.push_back(valueType(params.updategateweightmatrix()));
    weightTypeList.push_back(valueType(params.updategaterecursionmatrix()));
    weightTypeList.push_back(valueType(params.resetgateweightmatrix()));
    weightTypeList.push_back(valueType(params.resetgaterecursionmatrix()));
    weightTypeList.push_back(valueType(params.outputgateweightmatrix()));
    weightTypeList.push_back(valueType(params.outputgaterecursionmatrix()));
    if(hasBiasVectors){
        weightTypeList.push_back(valueType(params.updategatebiasvector()));
        weightTypeList.push_back(valueType(params.resetgatebiasvector()));
        weightTypeList.push_back(valueType(params.outputgatebiasvector()));
    }
    if(!isWeightParamTypeCompatible(weightTypeList)){
        const std::string err = "GRU layer '" + layer.name() + "' has invalid weight/recursion matrix or bias fields. "
        "Field value types should match and should be either half or full precision";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    // allen-continue


    // Check the size of the input matrices
    const uint64_t input_matrix_size = params.inputvectorsize() * params.outputvectorsize();
    const uint64_t outSize = params.outputvectorsize();
    r = validateGeneralWeightParams(params.updategateweightmatrix(), input_matrix_size,
                                    outSize, "GRU", layer.name(), "update gate weight matrix");
    if (!r.good()) return r;
    r = validateGeneralWeightParams(params.resetgateweightmatrix(), input_matrix_size,
                                    outSize, "GRU", layer.name(), "reset gate weight matrix");
    if (!r.good()) return r;
    r = validateGeneralWeightParams(params.outputgateweightmatrix(), input_matrix_size,
                                    outSize, "GRU", layer.name(), "output gate weight matrix");
    if (!r.good()) return r;

    // Check the size of the recurrent matrices
    const uint64_t recurrent_matrix_size = params.outputvectorsize() * params.outputvectorsize();
    r = validateGeneralWeightParams(params.updategaterecursionmatrix(), recurrent_matrix_size,
                                    outSize, "GRU", layer.name(), "update gate recursion matrix");
    if (!r.good()) return r;
    r = validateGeneralWeightParams(params.resetgaterecursionmatrix(), recurrent_matrix_size,
                                    outSize, "GRU", layer.name(), "reset gate recursion matrix");
    if (!r.good()) return r;
    r = validateGeneralWeightParams(params.outputgaterecursionmatrix(), recurrent_matrix_size,
                                    outSize, "GRU", layer.name(), "output gate recursion matrix");
    if (!r.good()) return r;

    if (hasBiasVectors){
        const uint64_t bias_size = params.outputvectorsize();
        r = validateGeneralWeightParams(params.updategatebiasvector(), bias_size, 1,
                                        "GRU", layer.name(), "update gate bias vector");
        if (!r.good()) return r;
        r = validateGeneralWeightParams(params.resetgatebiasvector(), bias_size, 1,
                                        "GRU", layer.name(), "reset gate bias vector");
        if (!r.good()) return r;
        r = validateGeneralWeightParams(params.outputgatebiasvector(), bias_size, 1,
                                        "GRU", layer.name(), "output gate bias vector");
        if (!r.good()) return r;
    }

    // Now check the activations
    for (const auto& activation : params.activations()) {
        r = validateRecurrentActivationParams(activation);
        if (!r.good()) {
            break;
        }
    }
    return r;
}